

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::checkTypeFromAnotherSchema
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr)

{
  short *psVar1;
  XMLStringPool *pXVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  XMLCh *pXVar5;
  long lVar6;
  short *psVar7;
  XMLCh *pXVar8;
  
  iVar3 = XMLString::indexOf(typeStr,L':');
  if (iVar3 + 1U < 2) {
    pXVar8 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,typeStr,(long)iVar3);
    pXVar2 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar4 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2);
    iVar3 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar4);
    pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar3);
  }
  pXVar5 = resolvePrefixToURI(this,elem,pXVar8);
  pXVar8 = this->fTargetNSURIString;
  if (pXVar5 == pXVar8) {
LAB_0032de1b:
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    if (pXVar8 == (XMLCh *)0x0 || pXVar5 == (XMLCh *)0x0) {
      if (pXVar5 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) goto LAB_0032de1b;
LAB_0032ddd0:
        if ((pXVar5 == L"http://www.w3.org/2001/XMLSchema") || (*pXVar8 == L'\0'))
        goto LAB_0032de1b;
        goto LAB_0032dddf;
      }
      if ((pXVar8 != (XMLCh *)0x0) && (*pXVar5 == L'\0')) goto LAB_0032ddd0;
      if (pXVar5 == L"http://www.w3.org/2001/XMLSchema" || *pXVar5 == L'\0') goto LAB_0032de1b;
    }
    else {
      lVar6 = 0;
      do {
        psVar7 = (short *)((long)pXVar5 + lVar6);
        if (*psVar7 == 0) {
          pXVar8 = (XMLCh *)((long)pXVar8 + lVar6);
          goto LAB_0032ddd0;
        }
        psVar1 = (short *)((long)pXVar8 + lVar6);
        lVar6 = lVar6 + 2;
      } while (*psVar7 == *psVar1);
      if (pXVar5 == L"http://www.w3.org/2001/XMLSchema") goto LAB_0032de1b;
LAB_0032dddf:
      if (pXVar5 == (XMLCh *)0x0) {
        psVar7 = &SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
LAB_0032de15:
        if (*psVar7 != 0) {
          return pXVar5;
        }
        goto LAB_0032de1b;
      }
    }
    lVar6 = 0;
    do {
      psVar7 = (short *)((long)pXVar5 + lVar6);
      if (*psVar7 == 0) {
        psVar7 = (short *)((long)&SchemaSymbols::fgURI_SCHEMAFORSCHEMA + lVar6);
        goto LAB_0032de15;
      }
      psVar1 = (short *)((long)&SchemaSymbols::fgURI_SCHEMAFORSCHEMA + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar7 == *psVar1);
  }
  return pXVar5;
}

Assistant:

const XMLCh*
TraverseSchema::checkTypeFromAnotherSchema(const DOMElement* const elem,
                                           const XMLCh* const typeStr) {

    const XMLCh* prefix = getPrefix(typeStr);
    const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && !XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
        ) {
        return typeURI;
    }

    return 0;
}